

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::base::LogFormat::~LogFormat(LogFormat *this)

{
  LogFormat *this_local;
  
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__LogFormat_001791c0;
  std::__cxx11::string::~string((string *)&this->m_currentHost);
  std::__cxx11::string::~string((string *)&this->m_currentUser);
  std::__cxx11::string::~string((string *)&this->m_dateTimeFormat);
  std::__cxx11::string::~string((string *)&this->m_format);
  std::__cxx11::string::~string((string *)&this->m_userFormat);
  Loggable::~Loggable(&this->super_Loggable);
  return;
}

Assistant:

virtual ~LogFormat(void) {}